

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataFileTests.cc
# Opt level: O1

void __thiscall DataFileTest::testSchemaReadWrite(DataFileTest *this)

{
  size_t __nbytes;
  void *__buf;
  uint32_t a;
  uint32_t b;
  DataFileReader<unsigned_int> df_1;
  DataFileWriter<unsigned_int> df;
  undefined1 *local_98;
  uint32_t *local_90;
  assertion_result local_88;
  const_string local_70;
  lazy_ostream local_60;
  undefined8 *local_50;
  char *local_48;
  undefined **local_40;
  undefined1 local_38;
  undefined8 *local_30;
  undefined1 **local_28;
  
  a = 0x2a;
  __nbytes = 0x4000;
  avro::DataFileWriter<unsigned_int>::DataFileWriter
            (&df,this->filename,&this->writerSchema,0x4000,NULL_CODEC);
  avro::DataFileWriterBase::syncIfNeeded();
  (**(code **)(**(long **)((long)df.base_._M_ptr + 0x30) + 0x60))
            (*(long **)((long)df.base_._M_ptr + 0x30),&a,4);
  *(long *)((long)df.base_._M_ptr + 0x70) = *(long *)((long)df.base_._M_ptr + 0x70) + 1;
  std::auto_ptr<avro::DataFileWriterBase>::~auto_ptr(&df.base_);
  avro::DataFileReader<unsigned_int>::DataFileReader(&df_1,this->filename);
  avro::DataFileReader<unsigned_int>::read(&df_1,(int)&b,__buf,__nbytes);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1bd8b0,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x19d2e5);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x1c0;
  local_60.m_empty = false;
  local_60._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001b9fb8;
  local_50 = &boost::unit_test::lazy_ostream::inst;
  local_48 = "";
  local_88.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(b == a);
  local_88.m_message.px = (element_type *)0x0;
  local_88.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_70.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
  ;
  local_70.m_end = "";
  df.base_._M_ptr = (auto_ptr<avro::DataFileWriterBase>)&PTR__lazy_ostream_001ba298;
  local_28 = &local_98;
  local_38 = 0;
  local_40 = &PTR__lazy_ostream_001ba298;
  local_30 = &boost::unit_test::lazy_ostream::inst;
  local_98 = (undefined1 *)&a;
  local_90 = &b;
  boost::test_tools::tt_detail::report_assertion
            (&local_88,&local_60,&local_70,0x1c0,CHECK,CHECK_EQUAL,2,"b",&df.base_,"a",&local_40);
  boost::detail::shared_count::~shared_count(&local_88.m_message.pn);
  std::auto_ptr<avro::DataFileReaderBase>::~auto_ptr(&df_1.base_);
  return;
}

Assistant:

void testSchemaReadWrite() {
    uint32_t a=42;
    {
            avro::DataFileWriter<uint32_t> df(filename, writerSchema);
        df.write(a);    
        }

        {
        avro::DataFileReader<uint32_t> df(filename);
        uint32_t b;
            df.read(b);
            BOOST_CHECK_EQUAL(b, a);
    }
    }